

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O3

bool FitTrackIBMPC(CylHead *cylhead,Track *track,int track_time_ms,FitDetails *details)

{
  int *t;
  DataRate datarate;
  Encoding encoding;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Sector *pSVar6;
  LogHelper *pLVar7;
  int i_1;
  int i;
  long lVar8;
  vector<int,_std::allocator<int>_> sizes;
  int local_94;
  int local_90;
  allocator_type local_89;
  int *local_88;
  int local_7c;
  CylHead *local_78;
  DataRate local_6c;
  undefined8 local_68;
  vector<int,_std::allocator<int>_> local_60;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_7c = track_time_ms;
  bVar1 = Track::empty(track);
  if ((bVar1) || (bVar1 = Track::is_mixed_encoding(track), bVar1)) {
    return false;
  }
  pSVar6 = Track::operator[](track,0);
  datarate = pSVar6->datarate;
  pSVar6 = Track::operator[](track,0);
  encoding = pSVar6->encoding;
  local_38 = (ulong)encoding;
  if (encoding - RX02 < 0xfffffffe) {
    return false;
  }
  local_78 = cylhead;
  local_6c = datarate;
  iVar3 = GetRawTrackCapacity(local_7c,datarate,encoding);
  local_48 = (ulong)(uint)((iVar3 * 0x7cb) / 2000);
  local_68 = 0x21;
  if (encoding == MFM) {
    local_68 = 0x3e;
  }
  iVar3 = Track::size(track);
  std::vector<int,_std::allocator<int>_>::resize(&details->sector_units,(long)iVar3);
  iVar3 = Track::size(track);
  std::vector<int,_std::allocator<int>_>::vector(&local_60,(long)iVar3,&local_89);
  t = &details->size_code;
  local_88 = &details->gap3;
  local_40 = (ulong)((int)local_68 - 1);
  bVar1 = true;
  do {
    details->real_errors = bVar1;
    local_94 = 7;
    local_90 = 0;
    bVar1 = true;
    for (lVar8 = 0; iVar3 = Track::size(track), lVar8 < iVar3; lVar8 = lVar8 + 1) {
      pSVar6 = Track::operator[](track,(int)lVar8);
      if ((details->real_errors != false) || (bVar2 = Sector::has_good_data(pSVar6), bVar2)) {
        iVar3 = Sector::SizeCodeToRealSizeCode((pSVar6->header).size);
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8] = iVar3;
        bVar2 = Sector::has_good_data(pSVar6);
        if (local_90 < iVar3) {
          local_90 = iVar3;
        }
        if (iVar3 <= local_94) {
          local_94 = iVar3;
        }
        bVar1 = (bool)(bVar1 & !bVar2);
      }
      else {
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8] = -1;
      }
    }
    if (bVar1) {
      local_90 = 7;
    }
    *t = local_90;
    do {
      details->total_units = 0;
      for (lVar8 = 0; iVar3 = Track::size(track), lVar8 < iVar3; lVar8 = lVar8 + 1) {
        iVar3 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        iVar4 = 1;
        if ((-1 < iVar3) && (*t <= iVar3)) {
          iVar4 = Sector::SizeCodeToLength(iVar3);
          iVar3 = Sector::SizeCodeToLength(*t);
          iVar4 = iVar4 / iVar3;
        }
        (details->sector_units).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] = iVar4;
        details->total_units = details->total_units + iVar4;
      }
      if (details->total_units != 0) {
        iVar3 = GetFormatGap(local_7c,local_6c,(Encoding)local_38,details->total_units,*t);
        *local_88 = iVar3;
        if (iVar3 != 0) {
          bVar1 = true;
          if ((opt.debug != 0) &&
             ((iVar3 = details->total_units, iVar4 = Track::size(track), iVar3 != iVar4 ||
              (opt.verbose != 0)))) {
            pLVar7 = util::operator<<((LogHelper *)&util::cout,(char (*) [11])"FitTrack: ");
            pLVar7 = util::operator<<(pLVar7,local_78);
            pLVar7 = util::operator<<(pLVar7,(char (*) [12])" fits with ");
            pLVar7 = util::operator<<(pLVar7,&details->total_units);
            pLVar7 = util::operator<<(pLVar7,(char (*) [16])0x1aecc7);
            pLVar7 = util::operator<<(pLVar7,t);
            pLVar7 = util::operator<<(pLVar7,(char (*) [7])0x1ad3a3);
            pLVar7 = util::operator<<(pLVar7,local_88);
            util::operator<<(pLVar7,(char (*) [2])0x1ad40e);
          }
          goto LAB_00160b5f;
        }
      }
      iVar3 = *t;
      *t = iVar3 + -1;
    } while (0 < iVar3);
    *t = local_94;
    if (-1 < local_94) {
      do {
        *local_88 = 0xff;
        do {
          iVar3 = Sector::SizeCodeToLength(*t);
          iVar4 = iVar3 + (int)local_68 + details->gap3;
          details->total_units = 0;
          iVar3 = (int)local_40;
          for (lVar8 = 0; iVar5 = Track::size(track), lVar8 < iVar5; lVar8 = lVar8 + 1) {
            iVar5 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8];
            if (iVar5 < 0) {
              iVar5 = *t;
            }
            iVar5 = Sector::SizeCodeToLength(iVar5);
            iVar5 = (iVar5 + iVar3 + iVar4) / iVar4;
            (details->sector_units).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8] = iVar5;
            details->total_units = details->total_units + iVar5;
          }
          iVar3 = details->total_units;
          iVar4 = details->gap3;
          iVar5 = Sector::SizeCodeToLength(details->size_code);
          if ((iVar4 + (int)local_68 + iVar5) * iVar3 < (int)local_48) {
            bVar1 = true;
            if (opt.debug != 0) {
              pLVar7 = util::operator<<((LogHelper *)&util::cout,(char (*) [11])"FitTrack: ");
              pLVar7 = util::operator<<(pLVar7,local_78);
              pLVar7 = util::operator<<(pLVar7,(char (*) [12])" fits with ");
              pLVar7 = util::operator<<(pLVar7,&details->total_units);
              pLVar7 = util::operator<<(pLVar7,(char (*) [24])" clipped units of size=");
              pLVar7 = util::operator<<(pLVar7,t);
              pLVar7 = util::operator<<(pLVar7,(char (*) [7])0x1ad3a3);
              pLVar7 = util::operator<<(pLVar7,local_88);
              util::operator<<(pLVar7,(char (*) [2])0x1ad40e);
            }
            goto LAB_00160b5f;
          }
          iVar3 = *local_88;
          *local_88 = iVar3 + -1;
        } while (1 < iVar3);
        iVar3 = *t;
        *t = iVar3 + -1;
      } while (0 < iVar3);
    }
    bVar1 = false;
  } while (details->real_errors != false);
  if (opt.debug != 0) {
    pLVar7 = util::operator<<((LogHelper *)&util::cout,RED);
    pLVar7 = util::operator<<(pLVar7,(char (*) [25])"FitTrack: unable to fit ");
    pLVar7 = util::operator<<(pLVar7,local_78);
    pLVar7 = util::operator<<(pLVar7,none);
    util::operator<<(pLVar7,(char (*) [2])0x1ad40e);
  }
  bVar1 = false;
LAB_00160b5f:
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    return bVar1;
  }
  operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return bVar1;
}

Assistant:

bool FitTrackIBMPC(const CylHead& cylhead, const Track& track, int track_time_ms, FitDetails& details)
{
    if (track.empty() || track.is_mixed_encoding())
        return false;

    auto datarate = track[0].datarate;
    auto encoding = track[0].encoding;
    if (encoding != Encoding::MFM && encoding != Encoding::FM)
        return false;

    auto track_space = GetTrackCapacity(track_time_ms, datarate, encoding);
    auto sector_overhead = GetSectorOverhead(encoding);

    details.sector_units.resize(track.size());
    std::vector<int> sizes(track.size());
    int min_size, max_size;

    // Check both with real errors and dummy errors
    for (details.real_errors = true; ; details.real_errors = false)
    {
        bool all_errors = true;
        min_size = SIZE_MASK_765;
        max_size = 0;

        // Determine the largest and smallest true sector sizes.
        for (int i = 0; i < track.size(); ++i)
        {
            auto& s = track[i];

            if (!details.real_errors && !s.has_good_data())
                sizes[i] = -1;
            else
            {
                sizes[i] = Sector::SizeCodeToRealSizeCode(s.header.size);
                min_size = std::min(sizes[i], min_size);
                max_size = std::max(sizes[i], max_size);
                all_errors &= !s.has_good_data();
            }
        }

        // If all sectors are bad, consider the largest size that works.
        if (all_errors)
            max_size = SIZE_MASK_765;

        // Attempt to fit using simple size multiples, and either trusting or ignoring the size
        // of sectors that don't have a good data field.
        for (details.size_code = max_size; details.size_code >= 0; --details.size_code)
        {
            details.total_units = 0;
            for (int i = 0; i < track.size(); ++i)
            {
                details.sector_units[i] = (sizes[i] < 0 || sizes[i] < details.size_code) ? 1 :
                    (Sector::SizeCodeToLength(sizes[i]) / Sector::SizeCodeToLength(details.size_code));
                details.total_units += details.sector_units[i];
            }

            if (!details.total_units)
                continue;

            // Try standard format gaps, or calculate one that is suitable
            details.gap3 =
                GetFormatGap(track_time_ms, datarate, encoding, details.total_units, details.size_code);

            if (details.gap3)
            {
                // In debug, show the unit count wasn't obvious (unless forced)
                if (opt.debug && (details.total_units != track.size() || opt.verbose))
                    util::cout << "FitTrack: " << cylhead << " fits with " << details.total_units <<
                    " units of size=" << details.size_code << " gap3=" << details.gap3 << "\n";

                return true;
            }
        }

        // Attempt a more difficult fit using size and gap3 variations.
        for (details.size_code = min_size; details.size_code >= 0; --details.size_code)
        {
            for (details.gap3 = 255; details.gap3 > 0; --details.gap3)
            {
                auto unit_length =
                    sector_overhead + Sector::SizeCodeToLength(details.size_code) + details.gap3;

                details.total_units = 0;
                for (int i = 0; i < track.size(); ++i)
                {
                    auto needed_length = sector_overhead +
                        Sector::SizeCodeToLength(((sizes[i] < 0) ? details.size_code : sizes[i]));

                    details.sector_units[i] = (needed_length + unit_length - 1) / unit_length;
                    details.total_units += details.sector_units[i];
                }

                auto total_size =
                    GetFormatLength(encoding, details.total_units, details.size_code, details.gap3);
                if (total_size < track_space)
                {
                    if (opt.debug)
                        util::cout << "FitTrack: " << cylhead << " fits with " <<
                        details.total_units << " clipped units of size=" << details.size_code <<
                        " gap3=" << details.gap3 << "\n";
                    return true;
                }
            }
        }

        if (!details.real_errors)
            break;
    }

    if (opt.debug)
        util::cout << colour::RED << "FitTrack: unable to fit " << cylhead << colour::none << "\n";

    return false;
}